

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_url_options(connectdata *conn)

{
  short sVar1;
  char *first;
  int iVar2;
  char *value_00;
  bool bVar3;
  bool bVar4;
  char *value;
  char *key;
  char *pcStack_28;
  _Bool prefer_login;
  char *ptr;
  imap_conn *imapc;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  pcStack_28 = conn->options;
  bVar4 = false;
  while( true ) {
    first = pcStack_28;
    bVar3 = false;
    if ((imapc._4_4_ == CURLE_OK) && (bVar3 = false, pcStack_28 != (char *)0x0)) {
      bVar3 = *pcStack_28 != '\0';
    }
    if (!bVar3) break;
    while( true ) {
      bVar4 = false;
      if (*pcStack_28 != '\0') {
        bVar4 = *pcStack_28 != '=';
      }
      if (!bVar4) break;
      pcStack_28 = pcStack_28 + 1;
    }
    value_00 = pcStack_28 + 1;
    while( true ) {
      bVar4 = false;
      if (*pcStack_28 != '\0') {
        bVar4 = *pcStack_28 != ';';
      }
      if (!bVar4) break;
      pcStack_28 = pcStack_28 + 1;
    }
    iVar2 = curl_strnequal(first,"AUTH=+LOGIN",0xb);
    if (iVar2 == 0) {
      iVar2 = curl_strnequal(first,"AUTH=",5);
      if (iVar2 == 0) {
        imapc._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        imapc._4_4_ = Curl_sasl_parse_url_auth_option
                                (&(conn->proto).imapc.sasl,value_00,
                                 (long)pcStack_28 - (long)value_00);
      }
      bVar4 = false;
    }
    else {
      bVar4 = true;
      *(undefined2 *)((long)&conn->proto + 0xba) = 0;
    }
    if (*pcStack_28 == ';') {
      pcStack_28 = pcStack_28 + 1;
    }
  }
  if (bVar4) {
    (conn->proto).imapc.preftype = '\x01';
  }
  else {
    sVar1 = *(short *)((long)&conn->proto + 0xba);
    if (sVar1 == 0) {
      (conn->proto).imapc.preftype = '\0';
    }
    else if (sVar1 == -0x21) {
      (conn->proto).imapc.preftype = '\x03';
    }
    else {
      (conn->proto).imapc.preftype = '\x02';
    }
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *ptr = conn->options;
  bool prefer_login = FALSE;

  while(!result && ptr && *ptr) {
    const char *key = ptr;
    const char *value;

    while(*ptr && *ptr != '=')
      ptr++;

    value = ptr + 1;

    while(*ptr && *ptr != ';')
      ptr++;

    if(strncasecompare(key, "AUTH=+LOGIN", 11)) {
      /* User prefers plaintext LOGIN over any SASL, including SASL LOGIN */
      prefer_login = TRUE;
      imapc->sasl.prefmech = SASL_AUTH_NONE;
    }
    else if(strncasecompare(key, "AUTH=", 5)) {
      prefer_login = FALSE;
      result = Curl_sasl_parse_url_auth_option(&imapc->sasl,
                                               value, ptr - value);
    }
    else {
      prefer_login = FALSE;
      result = CURLE_URL_MALFORMAT;
    }

    if(*ptr == ';')
      ptr++;
  }

  if(prefer_login)
    imapc->preftype = IMAP_TYPE_CLEARTEXT;
  else {
    switch(imapc->sasl.prefmech) {
    case SASL_AUTH_NONE:
      imapc->preftype = IMAP_TYPE_NONE;
      break;
    case SASL_AUTH_DEFAULT:
      imapc->preftype = IMAP_TYPE_ANY;
      break;
    default:
      imapc->preftype = IMAP_TYPE_SASL;
      break;
    }
  }

  return result;
}